

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_cpio.c
# Opt level: O0

int header_bin_le(archive_read *a,cpio_conflict *cpio,archive_entry *entry,size_t *namelength,
                 size_t *name_pad)

{
  mode_t mVar1;
  void *pvVar2;
  int64_t iVar3;
  uchar *header;
  void *h;
  size_t *name_pad_local;
  size_t *namelength_local;
  archive_entry *entry_local;
  cpio_conflict *cpio_local;
  archive_read *a_local;
  
  (a->archive).archive_format = 0x10002;
  (a->archive).archive_format_name = "cpio (little-endian binary)";
  pvVar2 = __archive_read_ahead(a,0x1a,(ssize_t *)0x0);
  if (pvVar2 == (void *)0x0) {
    archive_set_error(&a->archive,0,"End of file trying to read next cpio header");
    a_local._4_4_ = -0x1e;
  }
  else {
    archive_entry_set_dev
              (entry,(long)(int)((uint)*(byte *)((long)pvVar2 + 2) +
                                (uint)*(byte *)((long)pvVar2 + 3) * 0x100));
    archive_entry_set_ino
              (entry,(long)(int)((uint)*(byte *)((long)pvVar2 + 4) +
                                (uint)*(byte *)((long)pvVar2 + 5) * 0x100));
    archive_entry_set_mode
              (entry,(uint)*(byte *)((long)pvVar2 + 6) + (uint)*(byte *)((long)pvVar2 + 7) * 0x100);
    if (cpio->option_pwb != 0) {
      mVar1 = archive_entry_mode(entry);
      archive_entry_set_mode(entry,mVar1 & 0x6fff);
      mVar1 = archive_entry_mode(entry);
      if ((mVar1 & 0xf000) == 0) {
        mVar1 = archive_entry_mode(entry);
        archive_entry_set_mode(entry,mVar1 | 0x8000);
      }
    }
    archive_entry_set_uid
              (entry,(long)(int)((uint)*(byte *)((long)pvVar2 + 8) +
                                (uint)*(byte *)((long)pvVar2 + 9) * 0x100));
    archive_entry_set_gid
              (entry,(long)(int)((uint)*(byte *)((long)pvVar2 + 10) +
                                (uint)*(byte *)((long)pvVar2 + 0xb) * 0x100));
    archive_entry_set_nlink
              (entry,(uint)*(byte *)((long)pvVar2 + 0xc) +
                     (uint)*(byte *)((long)pvVar2 + 0xd) * 0x100);
    archive_entry_set_rdev
              (entry,(long)(int)((uint)*(byte *)((long)pvVar2 + 0xe) +
                                (uint)*(byte *)((long)pvVar2 + 0xf) * 0x100));
    iVar3 = le4((uchar *)((long)pvVar2 + 0x10));
    archive_entry_set_mtime(entry,iVar3,0);
    *namelength = (long)(int)((uint)*(byte *)((long)pvVar2 + 0x14) +
                             (uint)*(byte *)((long)pvVar2 + 0x15) * 0x100);
    *name_pad = *namelength & 1;
    iVar3 = le4((uchar *)((long)pvVar2 + 0x16));
    cpio->entry_bytes_remaining = iVar3;
    archive_entry_set_size(entry,cpio->entry_bytes_remaining);
    cpio->entry_padding = cpio->entry_bytes_remaining & 1;
    __archive_read_consume(a,0x1a);
    a_local._4_4_ = 0;
  }
  return a_local._4_4_;
}

Assistant:

static int
header_bin_le(struct archive_read *a, struct cpio *cpio,
    struct archive_entry *entry, size_t *namelength, size_t *name_pad)
{
	const void *h;
	const unsigned char *header;

	a->archive.archive_format = ARCHIVE_FORMAT_CPIO_BIN_LE;
	a->archive.archive_format_name = "cpio (little-endian binary)";

	/* Read fixed-size portion of header. */
	h = __archive_read_ahead(a, bin_header_size, NULL);
	if (h == NULL) {
	    archive_set_error(&a->archive, 0,
		"End of file trying to read next cpio header");
	    return (ARCHIVE_FATAL);
	}

	/* Parse out binary fields. */
	header = (const unsigned char *)h;

	archive_entry_set_dev(entry, header[bin_dev_offset] + header[bin_dev_offset + 1] * 256);
	archive_entry_set_ino(entry, header[bin_ino_offset] + header[bin_ino_offset + 1] * 256);
	archive_entry_set_mode(entry, header[bin_mode_offset] + header[bin_mode_offset + 1] * 256);
	if (cpio->option_pwb) {
		/* turn off random bits left over from V6 inode */
		archive_entry_set_mode(entry, archive_entry_mode(entry) & 067777);
		if ((archive_entry_mode(entry) & AE_IFMT) == 0)
			archive_entry_set_mode(entry, archive_entry_mode(entry) | AE_IFREG);
	}
	archive_entry_set_uid(entry, header[bin_uid_offset] + header[bin_uid_offset + 1] * 256);
	archive_entry_set_gid(entry, header[bin_gid_offset] + header[bin_gid_offset + 1] * 256);
	archive_entry_set_nlink(entry, header[bin_nlink_offset] + header[bin_nlink_offset + 1] * 256);
	archive_entry_set_rdev(entry, header[bin_rdev_offset] + header[bin_rdev_offset + 1] * 256);
	archive_entry_set_mtime(entry, le4(header + bin_mtime_offset), 0);
	*namelength = header[bin_namesize_offset] + header[bin_namesize_offset + 1] * 256;
	*name_pad = *namelength & 1; /* Pad to even. */

	cpio->entry_bytes_remaining = le4(header + bin_filesize_offset);
	archive_entry_set_size(entry, cpio->entry_bytes_remaining);
	cpio->entry_padding = cpio->entry_bytes_remaining & 1; /* Pad to even. */
	__archive_read_consume(a, bin_header_size);
	return (ARCHIVE_OK);
}